

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::CullingTest::iterate(CullingTest *this)

{
  pointer *this_00;
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  RenderTarget *pRVar6;
  PixelFormat *pPVar7;
  undefined1 local_538 [8];
  TriangleSceneSpec scene;
  RasterizationArguments args;
  MessageBuilder local_500;
  char *local_380;
  MessageBuilder local_378;
  char *local_1f8;
  MessageBuilder local_1f0;
  long local_70;
  Functions *gl;
  undefined1 local_58 [8];
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  triangles;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  CullingTest *this_local;
  
  iVar2 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,iVar2,iVar2);
  this_00 = &triangles.
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)this_00);
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::vector((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            *)local_58);
  generateVertices(this,(vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        this_00);
  extractTriangles(this,(vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                         *)local_58,
                   (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                   &triangles.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pRVar3 = gles2::Context::getRenderContext
                     ((this->super_BaseRenderingCase).super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  local_70 = CONCAT44(extraout_var,iVar2);
  (**(code **)(local_70 + 0x5e0))(0xb44);
  (**(code **)(local_70 + 0x418))(this->m_cullMode);
  (**(code **)(local_70 + 0x6c0))(this->m_faceOrder);
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::TestLog::operator<<(&local_1f0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1f0,(char (*) [23])"Setting front face to ");
  local_1f8 = glu::getWindingName(this->m_faceOrder);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1f8);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1f0);
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::TestLog::operator<<(&local_378,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_378,(char (*) [22])"Setting cull face to ");
  local_380 = glu::getFaceName(this->m_cullMode);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_380);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_378);
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::TestLog::operator<<(&local_500,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_500,(char (*) [23])"Drawing test pattern (");
  args._12_8_ = glu::getPrimitiveTypeName(this->m_primitive);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char **)&args.greenBits);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2a85ff4);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_500);
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,
             (Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &triangles.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this->m_primitive);
  tcu::TriangleSceneSpec::TriangleSceneSpec((TriangleSceneSpec *)local_538);
  scene.triangles.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       (this->super_BaseRenderingCase).m_numSamples;
  pRVar6 = gles2::Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context)
  ;
  pPVar7 = tcu::RenderTarget::getPixelFormat(pRVar6);
  args.numSamples = pPVar7->redBits;
  pRVar6 = gles2::Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context)
  ;
  pPVar7 = tcu::RenderTarget::getPixelFormat(pRVar6);
  args.subpixelBits = pPVar7->greenBits;
  pRVar6 = gles2::Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context)
  ;
  pPVar7 = tcu::RenderTarget::getPixelFormat(pRVar6);
  args.redBits = pPVar7->blueBits;
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::swap((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          *)local_538,
         (vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          *)local_58);
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  bVar1 = tcu::verifyTriangleGroupRasterization
                    ((Surface *)
                     &drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (TriangleSceneSpec *)local_538,
                     (RasterizationArguments *)
                     ((long)&scene.triangles.
                             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),pTVar4,
                     VERIFICATIONMODE_WEAK);
  if (bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Incorrect rendering");
  }
  tcu::TriangleSceneSpec::~TriangleSceneSpec((TriangleSceneSpec *)local_538);
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~vector((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             *)local_58);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &triangles.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::Surface::~Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return STOP;
}

Assistant:

CullingTest::IterateResult CullingTest::iterate (void)
{
	tcu::Surface									resultImage(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	// generate scene
	generateVertices(drawBuffer);
	extractTriangles(triangles, drawBuffer);

	// draw image
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.enable(GL_CULL_FACE);
		gl.cullFace(m_cullMode);
		gl.frontFace(m_faceOrder);

		m_testCtx.getLog() << tcu::TestLog::Message << "Setting front face to " << glu::getWindingName(m_faceOrder) << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting cull face to " << glu::getFaceName(m_cullMode) << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing test pattern (" << glu::getPrimitiveTypeName(m_primitive) << ")" << tcu::TestLog::EndMessage;

		drawPrimitives(resultImage, drawBuffer, m_primitive);
	}

	// compare
	{
		RasterizationArguments	args;
		TriangleSceneSpec		scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= m_context.getRenderTarget().getPixelFormat().redBits;
		args.greenBits		= m_context.getRenderTarget().getPixelFormat().greenBits;
		args.blueBits		= m_context.getRenderTarget().getPixelFormat().blueBits;

		scene.triangles.swap(triangles);

		if (verifyTriangleGroupRasterization(resultImage, scene, args, m_testCtx.getLog(), tcu::VERIFICATIONMODE_WEAK))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rendering");
	}

	return STOP;
}